

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_pack.c
# Opt level: O1

void upack_ctx(char **buf,CtxMsg *cmsg)

{
  uint uVar1;
  
  uVar1 = *(uint *)*buf;
  *buf = (char *)((long)*buf + 4);
  cmsg->ctx = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  return;
}

Assistant:

static ck_uint32 upack_int(char **buf)
{
    unsigned char *ubuf = (unsigned char *)*buf;
    ck_uint32 uval;

    uval =
        (ck_uint32) ((ubuf[0] << 24) | (ubuf[1] << 16) | (ubuf[2] << 8) |
                     ubuf[3]);

    *buf += 4;

    return uval;
}